

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartFunction<duckdb::date_t>(DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  ulong *puVar3;
  VectorType VVar4;
  VectorType VVar5;
  undefined4 uVar6;
  unsigned_long *puVar7;
  long *plVar8;
  SelectionVector *count;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var12;
  sel_t *psVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  element_type *peVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  reference vector;
  reference vector_00;
  long lVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  SelectionVector *pSVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  SelectionVector *pSVar23;
  ulong uVar24;
  SelectionVector *pSVar25;
  unsigned_long uVar26;
  ValidityMask *other;
  idx_t idx_in_entry;
  ulong uVar27;
  data_ptr_t pdVar28;
  data_ptr_t pdVar29;
  UnifiedVectorFormat ldata;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  data_ptr_t local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar4 = vector->vector_type;
  VVar5 = vector_00->vector_type;
  if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar8 = (long *)result->data;
    if (((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) &&
       ((puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar7 == (unsigned_long *)0x0 || ((*puVar7 & 1) != 0)))) {
      lVar19 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined4 *)vector_00->data,&result->validity,0);
      *plVar8 = lVar19;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar28 = vector->data;
      pdVar9 = vector_00->data;
      puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar10 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          _Var22._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar29 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar29;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
        if (_Var22._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar7 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar7 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar7[uVar24];
            }
            pSVar21 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar21) {
              pSVar21 = count;
            }
            pSVar23 = pSVar21;
            if (uVar26 != 0) {
              pSVar23 = pSVar25;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar21) {
                  uVar6 = *(undefined4 *)pdVar9;
                  pdVar29 = pdVar28 + (long)pSVar25 * 0x10 + 8;
                  do {
                    lVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (*(undefined8 *)(pdVar29 + -8),*(undefined8 *)pdVar29,uVar6,
                                        pVVar1,pSVar25);
                    *(long *)(pdVar10 + (long)pSVar25 * 8) = lVar19;
                    pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
                    pdVar29 = pdVar29 + 0x10;
                    pSVar23 = pSVar25;
                  } while (pSVar21 != pSVar25);
                }
              }
              else if (pSVar25 < pSVar21) {
                pdVar29 = pdVar28 + (long)pSVar25 * 0x10 + 8;
                uVar27 = 0;
                do {
                  if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                    lVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (*(undefined8 *)(pdVar29 + -8),*(undefined8 *)pdVar29,
                                        *(undefined4 *)pdVar9,pVVar1,
                                        (long)&pSVar25->sel_vector + uVar27);
                    *(long *)(pdVar10 + uVar27 * 8 + (long)pSVar25 * 8) = lVar19;
                  }
                  uVar27 = uVar27 + 1;
                  pdVar29 = pdVar29 + 0x10;
                } while ((long)pSVar25 + (uVar27 - (long)pSVar21) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar25 = pSVar23;
          } while (uVar24 != (ulong)puVar2 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar6 = *(undefined4 *)pdVar9;
        pdVar28 = pdVar28 + 8;
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar19 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                             (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,uVar6,pVVar1,
                              pSVar25);
          *(long *)(pdVar10 + (long)pSVar25 * 8) = lVar19;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
          pdVar28 = pdVar28 + 0x10;
        } while (count != pSVar25);
        return;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar5 != FLAT_VECTOR) {
        if (VVar5 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar28 = vector->data;
          pdVar9 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar10 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78.sel = count;
            if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
            }
            _Var22._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_78.sel = count;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                       (unsigned_long *)&local_78);
            pdVar29 = local_c8.data;
            pSVar25 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar25;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar29;
            if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var22._M_head_impl =
                 (pTVar20->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
          FlatVector::VerifyFlatVector(vector_00);
          other = &vector_00->validity;
          if (_Var22._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_78.sel = count;
              if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
              }
              _Var22._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_78.sel = count;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_78);
              pdVar29 = local_c8.data;
              pSVar25 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar25;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar29;
              if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var22._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl
            ;
          }
          else {
            ValidityMask::Combine(pVVar1,other,(idx_t)count);
          }
          if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              pdVar28 = pdVar28 + 8;
              pSVar25 = (SelectionVector *)0x0;
              do {
                lVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                   (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,
                                    *(undefined4 *)(pdVar9 + (long)pSVar25 * 4),pVVar1,pSVar25);
                *(long *)(pdVar10 + (long)pSVar25 * 8) = lVar19;
                pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
                pdVar28 = pdVar28 + 0x10;
              } while (count != pSVar25);
            }
          }
          else {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar2) {
              pdVar28 = pdVar28 + 8;
              uVar24 = 0;
              pSVar25 = (SelectionVector *)0x0;
              local_d8 = pdVar28;
              do {
                puVar7 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar7 == (unsigned_long *)0x0) {
                  uVar26 = 0xffffffffffffffff;
                }
                else {
                  uVar26 = puVar7[uVar24];
                }
                pSVar21 = (SelectionVector *)
                          &pSVar25[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar21) {
                  pSVar21 = count;
                }
                pSVar23 = pSVar21;
                if (uVar26 != 0) {
                  pSVar23 = pSVar25;
                  if (uVar26 == 0xffffffffffffffff) {
                    if (pSVar25 < pSVar21) {
                      pdVar29 = pdVar28 + (long)pSVar25 * 0x10;
                      do {
                        lVar19 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                           (*(undefined8 *)(pdVar29 + -8),*(undefined8 *)pdVar29,
                                            *(undefined4 *)(pdVar9 + (long)pSVar25 * 4),pVVar1,
                                            pSVar25);
                        *(long *)(pdVar10 + (long)pSVar25 * 8) = lVar19;
                        pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
                        pdVar29 = pdVar29 + 0x10;
                        pSVar23 = pSVar25;
                      } while (pSVar21 != pSVar25);
                    }
                  }
                  else if (pSVar25 < pSVar21) {
                    pdVar28 = pdVar28 + (long)pSVar25 * 0x10;
                    uVar27 = 0;
                    do {
                      if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar19 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                           (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,
                                            *(undefined4 *)(pdVar9 + uVar27 * 4 + (long)pSVar25 * 4)
                                            ,pVVar1,(long)&pSVar25->sel_vector + uVar27);
                        *(long *)(pdVar10 + uVar27 * 8 + (long)pSVar25 * 8) = lVar19;
                      }
                      uVar27 = uVar27 + 1;
                      pdVar28 = pdVar28 + 0x10;
                    } while ((long)pSVar25 + (uVar27 - (long)pSVar21) != 0);
                    pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
                    pdVar28 = local_d8;
                  }
                }
                uVar24 = uVar24 + 1;
                pSVar25 = pSVar23;
              } while (uVar24 != (ulong)puVar2 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_c8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar28 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var12._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar13 = (local_78.sel)->sel_vector;
              pSVar25 = (SelectionVector *)0x0;
              do {
                pSVar21 = pSVar25;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var12._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar21 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var12._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar25 * 4);
                }
                pSVar23 = pSVar25;
                if (psVar13 != (sel_t *)0x0) {
                  pSVar23 = (SelectionVector *)(ulong)psVar13[(long)pSVar25];
                }
                uVar15._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar21 * 0x10))->_M_use_count;
                uVar15._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar21 * 0x10))->_M_weak_count;
                lVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar21 * 0x10))->_vptr__Sp_counted_base,
                                    uVar15,*(undefined4 *)(local_78.data + (long)pSVar23 * 4),pVVar1
                                    ,pSVar25);
                *(long *)(pdVar28 + (long)pSVar25 * 8) = lVar19;
                pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
              } while (count != pSVar25);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var12._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar13 = (local_78.sel)->sel_vector;
            pSVar25 = (SelectionVector *)0x0;
            do {
              pSVar21 = pSVar25;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var12._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar21 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var12._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar25 * 4);
              }
              pSVar23 = pSVar25;
              if (psVar13 != (sel_t *)0x0) {
                pSVar23 = (SelectionVector *)(ulong)psVar13[(long)pSVar25];
              }
              if (((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar21 >> 6] >> ((ulong)pSVar21 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar23 >> 6] >> ((ulong)pSVar23 & 0x3f) & 1) != 0)))) {
                uVar14._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar21 * 0x10))->_M_use_count;
                uVar14._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar21 * 0x10))->_M_weak_count;
                lVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar21 * 0x10))->_vptr__Sp_counted_base,
                                    uVar14,*(undefined4 *)(local_78.data + (long)pSVar23 * 4),pVVar1
                                    ,pSVar25);
                *(long *)(pdVar28 + (long)pSVar25 * 8) = lVar19;
              }
              else {
                if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var18 = p_Stack_e0;
                  peVar17 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar17;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var18;
                  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar16 = (byte)pSVar25 & 0x3f;
                puVar3 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         ((ulong)pSVar25 >> 6);
                *puVar3 = *puVar3 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
              }
              pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
            } while (count != pSVar25);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar28 = vector->data;
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar9 = vector_00->data;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar10 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          _Var22._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar29 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar29;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
        if (_Var22._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar7 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar7 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar7[uVar24];
            }
            pSVar21 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar21) {
              pSVar21 = count;
            }
            pSVar23 = pSVar21;
            if (uVar26 != 0) {
              pSVar23 = pSVar25;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar21) {
                  uVar14 = *(undefined8 *)pdVar28;
                  uVar15 = *(undefined8 *)(pdVar28 + 8);
                  do {
                    lVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (uVar14,uVar15,*(undefined4 *)(pdVar9 + (long)pSVar23 * 4),
                                        pVVar1,pSVar23);
                    *(long *)(pdVar10 + (long)pSVar23 * 8) = lVar19;
                    pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                  } while (pSVar21 != pSVar23);
                }
              }
              else if (pSVar25 < pSVar21) {
                uVar27 = 0;
                do {
                  if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                    lVar19 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (*(undefined8 *)pdVar28,*(undefined8 *)(pdVar28 + 8),
                                        *(undefined4 *)(pdVar9 + uVar27 * 4 + (long)pSVar25 * 4),
                                        pVVar1,(long)&pSVar25->sel_vector + uVar27);
                    *(long *)(pdVar10 + uVar27 * 8 + (long)pSVar25 * 8) = lVar19;
                  }
                  uVar27 = uVar27 + 1;
                } while ((long)pSVar25 + (uVar27 - (long)pSVar21) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar25 = pSVar23;
          } while (uVar24 != (ulong)puVar2 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar14 = *(undefined8 *)pdVar28;
        uVar15 = *(undefined8 *)(pdVar28 + 8);
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar19 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                             (uVar14,uVar15,*(undefined4 *)(pdVar9 + (long)pSVar25 * 4),pVVar1,
                              pSVar25);
          *(long *)(pdVar10 + (long)pSVar25 * 8) = lVar19;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
        } while (count != pSVar25);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}